

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O3

int __thiscall
MediaManager::GetType
          (MediaManager *this,
          vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_> *wanted_types)

{
  int iVar1;
  pointer ppIVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  MediaType *wanted_type;
  int *piVar7;
  IMedia **it;
  pointer ppIVar8;
  vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_> *__range2;
  
  ppIVar8 = (this->media_list_).super__Vector_base<IMedia_*,_std::allocator<IMedia_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar2 = (this->media_list_).super__Vector_base<IMedia_*,_std::allocator<IMedia_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar8 == ppIVar2) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    uVar6 = 0;
    do {
      piVar7 = *(int **)wanted_types;
      piVar3 = *(int **)(wanted_types + 8);
      iVar1 = 0;
      if (piVar7 != piVar3) {
        do {
          iVar1 = *piVar7;
          iVar4 = (**(*ppIVar8)->_vptr_IMedia)();
          if (iVar1 == iVar4) {
            iVar1 = *piVar7;
            if (((iVar5 != 0) && (iVar1 != 0)) && (iVar1 != iVar5)) {
              return 0;
            }
            if (iVar1 == 3 && 1 < uVar6) {
              return 0;
            }
            goto LAB_0014e6f9;
          }
          piVar7 = piVar7 + 1;
        } while (piVar7 != piVar3);
        iVar1 = 0;
      }
LAB_0014e6f9:
      iVar5 = iVar1;
      uVar6 = uVar6 + 1;
      ppIVar8 = ppIVar8 + 1;
    } while (ppIVar8 != ppIVar2);
  }
  return iVar5;
}

Assistant:

int MediaManager::GetType(std::vector<MediaType> wanted_types)
{
   int result = MEDIA_UNDEF;
   int nb_media = 0;
   for (auto& it : media_list_)
   {
      // Maybe a use of Strategy pattern would do the job
      // RULES :
      // - Do not keep unwanted types
      int local_result = MEDIA_UNDEF;
      for (auto& wanted_type : wanted_types)
      {
         if (wanted_type == it->GetType())
         {
            local_result = wanted_type;
            break;
         }
      }
      // - No mixed types
      if (result != MEDIA_UNDEF && local_result != MEDIA_UNDEF && local_result != result)
      {
         return MEDIA_UNDEF;
      }
      // - No more than 2 DISK
      if (local_result == MEDIA_DISK && nb_media >= 2)
      {
         return MEDIA_UNDEF;
      }
      else
      {
         // - Unlimited number of tracks or ROM
         // - No more than 1 of any other
      }
      result = local_result;
      nb_media++;
   }
   return result;
}